

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlParserCtxtPtr htmlCreateMemoryParserCtxt(char *buffer,int size)

{
  htmlParserCtxtPtr ctxt;
  xmlParserInputBufferPtr pxVar1;
  xmlParserInputPtr input;
  
  if (((0 < size && buffer != (char *)0x0) &&
      (ctxt = htmlNewParserCtxt(), ctxt != (htmlParserCtxtPtr)0x0)) &&
     (pxVar1 = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE),
     pxVar1 != (xmlParserInputBufferPtr)0x0)) {
    input = xmlNewInputStream(ctxt);
    if (input != (xmlParserInputPtr)0x0) {
      input->filename = (char *)0x0;
      input->buf = pxVar1;
      xmlBufResetInput(pxVar1->buffer,input);
      inputPush(ctxt,input);
      return ctxt;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (htmlParserCtxtPtr)0x0;
}

Assistant:

htmlParserCtxtPtr
htmlCreateMemoryParserCtxt(const char *buffer, int size) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlParserInputBufferPtr buf;

    if (buffer == NULL)
	return(NULL);
    if (size <= 0)
	return(NULL);

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    buf = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) return(NULL);

    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    input->filename = NULL;
    input->buf = buf;
    xmlBufResetInput(buf->buffer, input);

    inputPush(ctxt, input);
    return(ctxt);
}